

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

int NULLCString::strcmp(char *__s1,char *__s2)

{
  int iVar1;
  int in_ECX;
  char *in_RDX;
  uint local_4c;
  int result;
  NULLCArray b_local;
  NULLCArray a_local;
  
  if (__s1 == (char *)0x0) {
    nullcThrowError("first string is null");
    a_local.ptr._4_4_ = 0xffffffff;
  }
  else if (in_RDX == (char *)0x0) {
    nullcThrowError("second string is null");
    a_local.ptr._4_4_ = 0xffffffff;
  }
  else if (((int)__s2 == 0) || (__s1[(int)__s2 - 1] != '\0')) {
    nullcThrowError("first string is not null-terminated");
    a_local.ptr._4_4_ = 0xffffffff;
  }
  else if ((in_ECX == 0) || (in_RDX[in_ECX - 1] != '\0')) {
    nullcThrowError("second string is not null-terminated");
    a_local.ptr._4_4_ = 0xffffffff;
  }
  else {
    iVar1 = ::strcmp(__s1,in_RDX);
    if (iVar1 < 0) {
      local_4c = 0xffffffff;
    }
    else {
      local_4c = (uint)(iVar1 != 0);
    }
    a_local.ptr._4_4_ = local_4c;
  }
  return a_local.ptr._4_4_;
}

Assistant:

int strcmp(NULLCArray a, NULLCArray b)
	{
		if(!a.ptr)
		{
			nullcThrowError("first string is null");
			return -1;
		}

		if(!b.ptr)
		{
			nullcThrowError("second string is null");
			return -1;
		}

		if(a.len == 0 || a.ptr[a.len - 1])
		{
			nullcThrowError("first string is not null-terminated");
			return -1;
		}

		if(b.len == 0 || b.ptr[b.len - 1])
		{
			nullcThrowError("second string is not null-terminated");
			return -1;
		}

		int result = ::strcmp(a.ptr, b.ptr);

		return result < 0 ? -1 : result == 0 ? 0 : 1;
	}